

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

int archive_write_add_filter_b64encode(archive *_a)

{
  int iVar1;
  archive_write_filter *n;
  undefined4 *puVar2;
  archive_string *in_RDI;
  int magic_test;
  private_b64encode *state;
  archive_write_filter *f;
  archive_write *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive_string *as;
  int local_4;
  
  as = in_RDI;
  n = __archive_write_allocate_filter
                ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    puVar2 = (undefined4 *)calloc(1,0x88);
    if (puVar2 == (undefined4 *)0x0) {
      archive_set_error(n->archive,0xc,"Can\'t allocate data for b64encode filter");
      local_4 = -0x1e;
    }
    else {
      *(undefined8 *)(puVar2 + 4) = 0;
      archive_strncat(as,in_RDI,(size_t)n);
      *puVar2 = 0x1a4;
      n->data = puVar2;
      n->name = "b64encode";
      n->code = 7;
      n->open = archive_filter_b64encode_open;
      n->options = archive_filter_b64encode_options;
      n->write = archive_filter_b64encode_write;
      n->close = archive_filter_b64encode_close;
      n->free = archive_filter_b64encode_free;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
archive_write_add_filter_b64encode(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_b64encode *state;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_uu");

	state = (struct private_b64encode *)calloc(1, sizeof(*state));
	if (state == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for b64encode filter");
		return (ARCHIVE_FATAL);
	}
	archive_strcpy(&state->name, "-");
	state->mode = 0644;

	f->data = state;
	f->name = "b64encode";
	f->code = ARCHIVE_FILTER_UU;
	f->open = archive_filter_b64encode_open;
	f->options = archive_filter_b64encode_options;
	f->write = archive_filter_b64encode_write;
	f->close = archive_filter_b64encode_close;
	f->free = archive_filter_b64encode_free;

	return (ARCHIVE_OK);
}